

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

int V_GetColor(DWORD *palette,char *str,FScriptPosition *sc)

{
  int iVar1;
  char *in_RAX;
  FString string;
  FString local_28;
  
  local_28.Chars = in_RAX;
  V_GetColorStringByName((char *)&local_28,(FScriptPosition *)str);
  if (*(int *)(local_28.Chars + -0xc) == 0) {
    local_28.Chars = str;
  }
  iVar1 = V_GetColorFromString(palette,local_28.Chars,sc);
  FString::~FString(&local_28);
  return iVar1;
}

Assistant:

int V_GetColor (const DWORD *palette, const char *str, FScriptPosition *sc)
{
	FString string = V_GetColorStringByName (str, sc);
	int res;

	if (!string.IsEmpty())
	{
		res = V_GetColorFromString (palette, string, sc);
	}
	else
	{
		res = V_GetColorFromString (palette, str, sc);
	}
	return res;
}